

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

int fct_clp__add_options(fct_clp_t *clp,fctcl_init_t *options)

{
  fctcl_t *itm;
  fctcl_init_t *in_RSI;
  fctcl_t *cpy;
  int ok;
  fctcl_init_t *pclo;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  while( true ) {
    if (in_RSI->action == FCTCL_STORE_UNDEFINED) {
      return 1;
    }
    itm = fctcl_new2(in_RSI);
    if (itm == (fctcl_t *)0x0) break;
    fct_nlist__append((fct_nlist_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      itm);
    in_RSI = in_RSI + 1;
  }
  return 0;
}

Assistant:

static int
fct_clp__add_options(fct_clp_t *clp, fctcl_init_t const *options)
{
    fctcl_init_t const *pclo =NULL;
    int ok;
    for ( pclo = options; pclo->action != FCTCL_STORE_UNDEFINED; ++pclo )
    {
        fctcl_t *cpy = fctcl_new2(pclo);
        if ( cpy == NULL )
        {
            ok = 0;
            goto finally;
        }
        fct_nlist__append(&(clp->clo_list), (void*)cpy);
    }
    ok =1;
finally:
    return ok;
}